

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int n_00;
  int iVar1;
  uint uVar2;
  int local_bc;
  int violation;
  int i;
  int n;
  int nt;
  sigaction act;
  char **argv_local;
  int argc_local;
  
  act.sa_restorer = (_func_void *)argv;
  if (2 < argc) {
    memset(&n,0,0x98);
    sigemptyset((sigset_t *)&act);
    _n = segv_handler;
    act.sa_mask.__val[0xf]._0_4_ = 4;
    sigaction(0xb,(sigaction *)&n,(sigaction *)0x0);
    n_00 = atoi(*(char **)(act.sa_restorer + 8));
    iVar1 = atoi(*(char **)(act.sa_restorer + 0x10));
    for (local_bc = 0; local_bc < iVar1; local_bc = local_bc + 1) {
      uVar2 = run_n_threads(n_00);
      if (uVar2 != 0) {
        printf("%d\n",(ulong)uVar2);
      }
    }
    return 0;
  }
  __assert_fail("argc >= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/mprotect_mt/main.cpp"
                ,0x75,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    assert(argc >= 3);
    struct sigaction act;
    memset(&act, 0, sizeof(struct sigaction));
    sigemptyset(&act.sa_mask);
    act.sa_sigaction = segv_handler;
    act.sa_flags = SA_SIGINFO;
    sigaction(SIGSEGV, &act, NULL);
    int nt = atoi(argv[1]);
    int n = atoi(argv[2]);
    for (int i = 0;i < n;i++) {
        if (int violation = run_n_threads(nt)) {
            printf("%d\n", violation);
        }
    }
    return 0;
}